

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

Result __thiscall
doctest::detail::Expression_lhs<double_const&>::operator==
          (Expression_lhs<double_const&> *this,double *rhs)

{
  double dVar1;
  double dVar2;
  double *in_RDX;
  String extraout_RDX;
  Result RVar3;
  void *local_20;
  
  dVar1 = *in_RDX;
  dVar2 = *(double *)*rhs;
  stringifyBinaryExpr<double,double>((detail *)&local_20,(double *)*rhs," == ",in_RDX);
  Result::Result((Result *)this,(bool)(-(dVar1 == dVar2) & 1),(String *)&local_20);
  free(local_20);
  RVar3.m_decomposition.m_str = extraout_RDX.m_str;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Result operator<=(const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs <= rhs, stringifyBinaryExpr(lhs, " <= ", rhs)); }